

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isblank_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  bool local_15;
  uint32_t props;
  UChar32 c_local;
  
  if ((uint)c < 0xa0) {
    local_15 = c == 9 || c == 0x20;
    props._3_1_ = local_15;
  }
  else {
    uVar1 = c >> 5;
    if ((uint)c < 0xd800) {
      local_24 = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar2 = 0;
        if (c < 0xdc00) {
          iVar2 = 0x140;
        }
        local_28 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < 0x110000) {
            local_30 = (uint)propsTrie_index
                             [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4
                       + (c & 0x1fU);
          }
          else {
            local_30 = 0x53c8;
          }
          local_2c = local_30;
        }
        else {
          local_2c = 0x11f4;
        }
        local_28 = local_2c;
      }
      local_24 = local_28;
    }
    props._3_1_ = (propsTrie_index[local_24] & 0x1f) == 0xc;
  }
  return props._3_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isblank(UChar32 c) {
    if((uint32_t)c<=0x9f) {
        return c==9 || c==0x20; /* TAB or SPACE */
    } else {
        /* Zs */
        uint32_t props;
        GET_PROPS(c, props);
        return (UBool)(GET_CATEGORY(props)==U_SPACE_SEPARATOR);
    }
}